

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RectangleTests::RewindingIteratorStartsOverWithPoints(RectangleTests *this)

{
  bool bVar1;
  FailedAssertion *this_00;
  long lVar2;
  rectangle r;
  point local_138;
  undefined8 local_12c;
  undefined4 local_124;
  undefined8 local_120;
  undefined4 local_118;
  undefined8 local_114;
  undefined4 local_10c;
  undefined8 local_108;
  undefined4 local_100;
  undefined8 local_fc;
  undefined4 local_f4;
  string local_f0;
  string local_d0;
  LocationInfo local_b0;
  point local_88;
  real_t local_7c;
  real_t rStack_78;
  int local_74;
  point local_70;
  point local_64;
  point local_58;
  point local_4c;
  rectangle local_3c;
  
  rectangle::rectangle(&local_3c,10.1,20.2,30.0,4.7);
  local_88.command = 0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  rectangle::vertex(&local_3c,&local_88.x,&local_88.y);
  local_88.command = 0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  rectangle::vertex(&local_3c,&local_88.x,&local_88.y);
  rectangle::rewind(&local_3c,(FILE *)0x0);
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_88.command = rectangle::vertex(&local_3c,&local_138.x,&local_138.y);
  local_88.x = local_138.x;
  local_88.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_74 = rectangle::vertex(&local_3c,&local_138.x,&local_138.y);
  local_7c = local_138.x;
  rStack_78 = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_70.command = rectangle::vertex(&local_3c,&local_138.x,&local_138.y);
  local_70.x = local_138.x;
  local_70.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_64.command = rectangle::vertex(&local_3c,&local_138.x,&local_138.y);
  local_64.x = local_138.x;
  local_64.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_58.command = rectangle::vertex(&local_3c,&local_138.x,&local_138.y);
  local_58.x = local_138.x;
  local_58.y = local_138.y;
  local_138.command = 0;
  local_138.x = 0.0;
  local_138.y = 0.0;
  local_4c.command = rectangle::vertex(&local_3c,&local_138.x,&local_138.y);
  local_4c.x = local_138.x;
  local_4c.y = local_138.y;
  local_138.x = 10.1;
  local_138.y = 20.2;
  local_138.command = 1;
  local_12c = 0x41a1999a41f00000;
  local_124 = 2;
  local_120 = 0x4096666641f00000;
  local_118 = 2;
  local_114 = 0x409666664121999a;
  local_10c = 2;
  local_108 = 0;
  local_100 = 0x30;
  local_fc = 0;
  local_f4 = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b0,&local_f0,0x99);
  lVar2 = 0;
  do {
    bVar1 = mocks::path::point::operator==
                      ((point *)((long)&local_138.x + lVar2),(point *)((long)&local_88.x + lVar2));
    if (!bVar1) {
      this_00 = (FailedAssertion *)__cxa_allocate_exception(0x38);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Value is not \'true\'!","");
      ut::FailedAssertion::FailedAssertion(this_00,&local_d0,&local_b0);
      __cxa_throw(this_00,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
    }
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p != &local_b0.filename.field_2) {
    operator_delete(local_b0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( RewindingIteratorStartsOverWithPoints )
			{
				// INIT
				rectangle r(10.1f, 20.2f, 30.0f, 4.7f);

				vertex(r), vertex(r);

				// ACT
				r.rewind(0);

				// ASSERT
				mocks::path::point points[] = { vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), };
				mocks::path::point reference[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference, points);
			}